

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O0

void __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,uint width,uint height,uint pitch,
          color_quad<unsigned_char,_int> *background,uint flags)

{
  color_quad<unsigned_char,_int> *pcVar1;
  uint flags_local;
  color_quad<unsigned_char,_int> *background_local;
  uint pitch_local;
  uint height_local;
  uint width_local;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_local;
  
  this->m_comp_flags = flags;
  vector<crnlib::color_quad<unsigned_char,_int>_>::vector(&this->m_pixel_buf);
  background_local._4_4_ = pitch;
  if (pitch == 0xffffffff) {
    background_local._4_4_ = width;
  }
  vector<crnlib::color_quad<unsigned_char,_int>_>::resize
            (&this->m_pixel_buf,background_local._4_4_ * height,false);
  this->m_width = width;
  this->m_height = height;
  this->m_pitch = background_local._4_4_;
  this->m_total = this->m_pitch * this->m_height;
  pcVar1 = vector<crnlib::color_quad<unsigned_char,_int>_>::front(&this->m_pixel_buf);
  this->m_pPixels = pcVar1;
  set_all(this,background);
  return;
}

Assistant:

image(uint width, uint height, uint pitch = UINT_MAX, const color_type& background = color_type::make_black(), uint flags = pixel_format_helpers::cDefaultCompFlags) :
            m_comp_flags(flags)
        {
            CRNLIB_ASSERT((width > 0) && (height > 0));
            if (pitch == UINT_MAX)
            {
                pitch = width;
            }

            m_pixel_buf.resize(pitch * height);

            m_width = width;
            m_height = height;
            m_pitch = pitch;
            m_total = m_pitch * m_height;

            m_pPixels = &m_pixel_buf.front();

            set_all(background);
        }